

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O3

void helicsCoreSetGlobal(HelicsCore core,char *valueName,char *value,HelicsError *err)

{
  element_type *peVar1;
  CoreObject *pCVar2;
  size_t sVar3;
  size_t sVar4;
  _Alloc_hider _Var5;
  
  pCVar2 = helics::getCoreObject(core,err);
  if ((pCVar2 != (CoreObject *)0x0) &&
     (peVar1 = (pCVar2->coreptr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr
     , peVar1 != (element_type *)0x0)) {
    if (valueName == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Global name cannot be null";
      }
    }
    else {
      sVar3 = strlen(valueName);
      sVar4 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
      _Var5 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
      if (value != (char *)0x0) {
        sVar4 = strlen(value);
        _Var5._M_p = value;
      }
      (*peVar1->_vptr_Core[0x5a])(peVar1,sVar3,valueName,sVar4,_Var5._M_p);
    }
  }
  return;
}

Assistant:

void helicsCoreSetGlobal(HelicsCore core, const char* valueName, const char* value, HelicsError* err)
{
    auto* cppcore = getCore(core, err);
    if (cppcore == nullptr) {
        return;
    }
    if (valueName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidGlobalString);
        return;
    }
    try {
        cppcore->setGlobal(valueName, AS_STRING_VIEW(value));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}